

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::CharacterNode::addValue
          (CharacterNode *this,void *value,UObjectDeleter *valueDeleter,UErrorCode *status)

{
  UErrorCode UVar1;
  UVector *this_00;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fValues != (void *)0x0) {
      if (this->fHasValuesVector == '\0') {
        this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)value);
        if (this_00 == (UVector *)0x0) {
          this_00 = (UVector *)0x0;
        }
        else {
          UVector::UVector(this_00,valueDeleter,(UElementsAreEqual *)0x0,1,status);
        }
        UVar1 = *status;
        if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
          UVector::addElement(this_00,this->fValues,status);
          this->fValues = this_00;
          this->fHasValuesVector = '\x01';
        }
        else if (valueDeleter != (UObjectDeleter *)0x0) {
          (*valueDeleter)(value);
        }
        if (U_ZERO_ERROR < UVar1) {
          return;
        }
      }
      UVector::addElement((UVector *)this->fValues,value,status);
      return;
    }
    this->fValues = value;
  }
  else if (valueDeleter != (UObjectDeleter *)0x0) {
    (*valueDeleter)(value);
    return;
  }
  return;
}

Assistant:

void
CharacterNode::addValue(void *value, UObjectDeleter *valueDeleter, UErrorCode &status) {
    if (U_FAILURE(status)) {
        if (valueDeleter) {
            valueDeleter(value);
        }
        return;
    }
    if (fValues == NULL) {
        fValues = value;
    } else {
        // At least one value already.
        if (!fHasValuesVector) {
            // There is only one value so far, and not in a vector yet.
            // Create a vector and add the old value.
            UVector *values = new UVector(valueDeleter, NULL, DEFAULT_CHARACTERNODE_CAPACITY, status);
            if (U_FAILURE(status)) {
                if (valueDeleter) {
                    valueDeleter(value);
                }
                return;
            }
            values->addElement(fValues, status);
            fValues = values;
            fHasValuesVector = TRUE;
        }
        // Add the new value.
        ((UVector *)fValues)->addElement(value, status);
    }
}